

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_PDU.cpp
# Opt level: O3

KBOOL __thiscall KDIS::PDU::IFF_PDU::operator==(IFF_PDU *this,IFF_PDU *Value)

{
  pointer pKVar1;
  pointer pKVar2;
  KBOOL KVar3;
  pointer pKVar4;
  LayerHeader **ppLVar5;
  bool bVar6;
  
  KVar3 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if ((((!KVar3) &&
       (KVar3 = DATA_TYPE::EntityIdentifier::operator!=
                          (&this->m_EmittingEntityID,&Value->m_EmittingEntityID), !KVar3)) &&
      (KVar3 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_EventID,&Value->m_EventID), !KVar3))
     && (((KVar3 = DATA_TYPE::Vector::operator!=(&this->m_Location,&Value->m_Location), !KVar3 &&
          (KVar3 = DATA_TYPE::SystemIdentifier::operator!=(&this->m_SystemID,&Value->m_SystemID),
          !KVar3)) &&
         (KVar3 = DATA_TYPE::FundamentalOperationalData::operator!=(&this->m_FOD,&Value->m_FOD),
         !KVar3)))) {
    pKVar1 = (this->m_vLayers).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pKVar2 = (this->m_vLayers).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pKVar4 = (Value->m_vLayers).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pKVar2 - (long)pKVar1 ==
        (long)(Value->m_vLayers).
              super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar4) {
      if (pKVar1 == pKVar2) {
        return true;
      }
      ppLVar5 = &pKVar4->m_pRef;
      do {
        pKVar4 = pKVar1 + 1;
        bVar6 = pKVar1->m_pRef == *ppLVar5;
        if (!bVar6) {
          return bVar6;
        }
        ppLVar5 = ppLVar5 + 3;
        pKVar1 = pKVar4;
      } while (pKVar4 != pKVar2);
      return bVar6;
    }
  }
  return false;
}

Assistant:

KBOOL IFF_PDU::operator == ( const IFF_PDU & Value ) const
{
    if( Header::operator    !=( Value ) )                 return false;
    if( m_EmittingEntityID  != Value.m_EmittingEntityID ) return false;
    if( m_EventID           != Value.m_EventID )          return false;
    if( m_Location          != Value.m_Location )         return false;
    if( m_SystemID          != Value.m_SystemID )         return false;
    if( m_FOD               != Value.m_FOD )              return false;
	if( m_vLayers           != Value.m_vLayers )          return false;
    return true;
}